

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

int __thiscall
QListModeViewBase::perItemScrollToValue
          (QListModeViewBase *this,int index,int scrollValue,int viewportSize,ScrollHint hint,
          Orientation orientation,bool wrap,int itemExtent)

{
  int iVar1;
  int *piVar2;
  QListViewPrivate *this_00;
  int *piVar3;
  long lVar4;
  iterator iVar5;
  iterator iVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_58;
  int index_local;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  index_local = index;
  if (-1 < index) {
    this_00 = (this->super_QCommonListViewBase).dd;
    iVar15 = itemExtent + this_00->space;
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
    QListViewPrivate::hiddenRowIds((QList<int> *)&local_58,this_00);
    iVar5 = QList<int>::begin((QList<int> *)&local_58);
    iVar6 = QList<int>::end((QList<int> *)&local_58);
    std::__sort<QList<int>::iterator,__gnu_cxx::__ops::_Iter_less_iter>(iVar5.i,iVar6.i);
    lVar7 = 0;
    uVar9 = 0xffffffff;
    do {
      uVar8 = (int)(undefined1 *)
                   (local_58.size + (ulong)((undefined1 *)local_58.size == (undefined1 *)0x0)) - 1;
      if ((long)(local_58.size + (ulong)((undefined1 *)local_58.size == (undefined1 *)0x0)) * 4 + -4
          == lVar7) break;
      uVar8 = uVar9 + 1;
      iVar13 = index + uVar9;
      piVar2 = (int *)((long)local_58.ptr + lVar7);
      lVar7 = lVar7 + 4;
      uVar9 = uVar8;
    } while (*piVar2 <= iVar13 + 1);
    if (wrap) {
      if (Vertical - (((this->super_QCommonListViewBase).dd)->flow == LeftToRight) == orientation) {
        iVar13 = (this->flowPositions).d.ptr[(int)(uVar8 + index)];
      }
      else {
        lVar7 = (this->segmentStartRows).d.size;
        iVar13 = scrollValue;
        if (lVar7 != 0) {
          iVar13 = qBinarySearch<int>(&this->segmentStartRows,&index_local,0,(int)lVar7 + -1);
          lVar7 = (long)iVar13;
          piVar3 = (this->segmentPositions).d.ptr;
          piVar2 = piVar3 + lVar7;
          iVar1 = scrollValue;
          if (iVar13 < scrollValue) {
            iVar1 = iVar13;
          }
          iVar10 = iVar13 + 1;
          do {
            iVar14 = iVar1;
            if (lVar7 <= scrollValue) break;
            lVar4 = lVar7 + -1;
            lVar7 = lVar7 + -1;
            iVar10 = iVar10 + -1;
            iVar14 = iVar10;
          } while ((iVar15 + *piVar2) - piVar3[lVar4] <= viewportSize);
          if (hint != PositionAtTop) {
            if (hint == PositionAtCenter) {
              iVar13 = ((iVar13 - iVar14) + 1) / -2 + iVar13;
            }
            else {
              iVar13 = scrollValue;
              if (hint == PositionAtBottom) {
                iVar13 = iVar14;
              }
            }
          }
        }
      }
    }
    else {
      iVar1 = uVar8 + index;
      piVar2 = (this->flowPositions).d.ptr;
      iVar13 = index + -1;
      iVar10 = index;
      while (0 < iVar10) {
        if (viewportSize < (iVar15 + piVar2[iVar1]) - piVar2[(long)(int)(uVar8 + iVar10) + -1])
        goto LAB_0051720a;
        iVar10 = iVar10 + -1;
        uVar11 = (int)uVar8 >> 0x1f & uVar8;
        iVar14 = uVar8 + iVar13;
        uVar12 = (ulong)uVar8;
        uVar9 = uVar8 + 1;
        do {
          uVar8 = uVar11;
          if ((int)uVar12 < 1) break;
          iVar14 = iVar14 + -1;
          uVar8 = uVar9 - 1;
          lVar7 = uVar12 - 1;
          uVar12 = uVar12 - 1;
          uVar9 = uVar8;
        } while (iVar14 <= local_58.ptr[lVar7]);
        iVar13 = iVar13 + -1;
      }
      iVar10 = 0;
LAB_0051720a:
      iVar13 = index;
      if (hint != PositionAtTop) {
        if (hint == PositionAtCenter) {
          iVar13 = ((index - iVar10) + 1) / -2 + index;
        }
        else {
          iVar13 = scrollValue;
          if (hint == PositionAtBottom) {
            iVar13 = iVar10;
          }
        }
      }
    }
    scrollValue = iVar13;
    QArrayDataPointer<int>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return scrollValue;
}

Assistant:

int QListModeViewBase::perItemScrollToValue(int index, int scrollValue, int viewportSize,
                                                 QAbstractItemView::ScrollHint hint,
                                                 Qt::Orientation orientation, bool wrap, int itemExtent) const
{
    if (index < 0)
        return scrollValue;

    itemExtent += spacing();
    QList<int> hiddenRows = dd->hiddenRowIds();
    std::sort(hiddenRows.begin(), hiddenRows.end());
    int hiddenRowsBefore = 0;
    for (int i = 0; i < hiddenRows.size() - 1; ++i)
        if (hiddenRows.at(i) > index + hiddenRowsBefore)
            break;
        else
            ++hiddenRowsBefore;
    if (!wrap) {
        int topIndex = index;
        const int bottomIndex = topIndex;
        const int bottomCoordinate = flowPositions.at(index + hiddenRowsBefore);
        while (topIndex > 0 &&
               (bottomCoordinate - flowPositions.at(topIndex + hiddenRowsBefore - 1) + itemExtent) <= (viewportSize)) {
            topIndex--;
            // will the next one be a hidden row -> skip
            while (hiddenRowsBefore > 0 && hiddenRows.at(hiddenRowsBefore - 1) >= topIndex + hiddenRowsBefore - 1)
                hiddenRowsBefore--;
        }

        const int itemCount = bottomIndex - topIndex + 1;
        switch (hint) {
        case QAbstractItemView::PositionAtTop:
            return index;
        case QAbstractItemView::PositionAtBottom:
            return index - itemCount + 1;
        case QAbstractItemView::PositionAtCenter:
            return index - (itemCount / 2);
        default:
            break;
        }
    } else { // wrapping
        Qt::Orientation flowOrientation = (flow() == QListView::LeftToRight
                                           ? Qt::Horizontal : Qt::Vertical);
        if (flowOrientation == orientation) { // scrolling in the "flow" direction
            // ### wrapped scrolling in the flow direction
            return flowPositions.at(index + hiddenRowsBefore); // ### always pixel based for now
        } else if (!segmentStartRows.isEmpty()) { // we are scrolling in the "segment" direction
            int segment = qBinarySearch<int>(segmentStartRows, index, 0, segmentStartRows.size() - 1);
            int leftSegment = segment;
            const int rightSegment = leftSegment;
            const int bottomCoordinate = segmentPositions.at(segment);

            while (leftSegment > scrollValue &&
                (bottomCoordinate - segmentPositions.at(leftSegment-1) + itemExtent) <= (viewportSize)) {
                    leftSegment--;
            }

            const int segmentCount = rightSegment - leftSegment + 1;
            switch (hint) {
            case QAbstractItemView::PositionAtTop:
                return segment;
            case QAbstractItemView::PositionAtBottom:
                return segment - segmentCount + 1;
            case QAbstractItemView::PositionAtCenter:
                return segment - (segmentCount / 2);
            default:
                break;
            }
        }
    }
    return scrollValue;
}